

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
          (TiledRgbaOutputFile *this,char *name,int width,int height,int tileXSize,int tileYSize,
          LevelMode mode,LevelRoundingMode rmode,RgbaChannels rgbaChannels,float pixelAspectRatio,
          V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder,
          Compression compression,int numThreads)

{
  void *pvVar1;
  _Base_ptr p_Var2;
  Header *in_RDI;
  uint in_R8D;
  uint in_R9D;
  LevelMode in_stack_00000008;
  LevelRoundingMode in_stack_00000010;
  uint in_stack_00000018;
  Header hd;
  int in_stack_0000018c;
  Header *in_stack_00000190;
  undefined4 in_stack_00000198;
  RgbaChannels in_stack_0000019c;
  Header *in_stack_000001a0;
  TileDescription *in_stack_ffffffffffffff88;
  Header *in_stack_ffffffffffffff90;
  RgbaChannels in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  Compression in_stack_ffffffffffffffac;
  LineOrder in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  V2f *in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Header *in_stack_ffffffffffffffd0;
  
  *(undefined ***)&(in_RDI->_map)._M_t._M_impl = &PTR__TiledRgbaOutputFile_002ad4d0;
  *(undefined8 *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  Header::Header(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  anon_unknown_23::insertChannels(in_stack_000001a0,in_stack_0000019c,(char *)in_stack_00000190);
  TileDescription::TileDescription
            ((TileDescription *)&stack0xffffffffffffff84,in_R8D,in_R9D,in_stack_00000008,
             in_stack_00000010);
  Header::setTileDescription(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pvVar1 = operator_new(0x20);
  TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)in_stack_000001a0,
             (char *)CONCAT44(in_stack_0000019c,in_stack_00000198),in_stack_00000190,
             in_stack_0000018c);
  *(void **)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header = pvVar1;
  if ((in_stack_00000018 & 0x10) != 0) {
    p_Var2 = (_Base_ptr)operator_new(0x78);
    ToYa::ToYa((ToYa *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (TiledOutputFile *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4);
    (in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var2;
  }
  Header::~Header(in_RDI);
  return;
}

Assistant:

TiledRgbaOutputFile::TiledRgbaOutputFile (
    const char                 name[],
    int                        width,
    int                        height,
    int                        tileXSize,
    int                        tileYSize,
    LevelMode                  mode,
    LevelRoundingMode          rmode,
    RgbaChannels               rgbaChannels,
    float                      pixelAspectRatio,
    const IMATH_NAMESPACE::V2f screenWindowCenter,
    float                      screenWindowWidth,
    LineOrder                  lineOrder,
    Compression                compression,
    int                        numThreads)
    : _outputFile (0), _toYa (0)
{
    Header hd (
        width,
        height,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);

    insertChannels (hd, rgbaChannels, name);
    hd.setTileDescription (TileDescription (tileXSize, tileYSize, mode, rmode));
    _outputFile = new TiledOutputFile (name, hd, numThreads);

    if (rgbaChannels & WRITE_Y) _toYa = new ToYa (*_outputFile, rgbaChannels);
}